

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O2

range_pair * __thiscall
srell::regex_internal::re_character_class::charclasspos(re_character_class *this,uint no)

{
  pointer prVar1;
  range_pair *prVar2;
  
  prVar1 = (this->char_class_pos_).buffer_;
  if ((uint)prVar1[no].second < 9) {
    prVar2 = prVar1 + no;
  }
  else {
    prVar2 = (this->char_class_pos_el_).buffer_ + no;
    if (prVar2->second == L'\0') {
      finalise(this,no);
    }
  }
  return prVar2;
}

Assistant:

const range_pair &charclasspos(const unsigned int no)	//  const
	{
		if (char_class_pos_[no].second <= lsearch_maxranges_)
			return char_class_pos_[no];
		else
		{
			const range_pair &pos = char_class_pos_el_[no];

			if (pos.second == 0)
				finalise(no);
			return pos;
		}
	}